

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_attribute_struct *xnode;
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  void *pvVar3;
  void *pvVar4;
  xml_node_struct *this_00;
  xml_node_struct *rn;
  xml_node_struct *ln;
  xml_node_struct *this_01;
  xml_attribute_struct *xnode_00;
  bool bVar5;
  
  this_00 = *(xml_node_struct **)this;
  xnode_00 = *(xml_attribute_struct **)(this + 8);
  pvVar3 = document_buffer_order((anon_unknown_0 *)this_00,(xpath_node *)xnode_00);
  this_01 = (lhs->_node)._root;
  xnode = (lhs->_attribute)._attr;
  pvVar4 = document_buffer_order((anon_unknown_0 *)this_01,(xpath_node *)xnode);
  if (pvVar4 == (void *)0x0 || pvVar3 == (void *)0x0) {
    if (xnode_00 == (xml_attribute_struct *)0x0) {
      if (xnode != (xml_attribute_struct *)0x0 && this_01 == this_00) {
        return true;
      }
    }
    else if ((xnode != (xml_attribute_struct *)0x0) && (this_00 == this_01)) {
      if (xnode_00 == xnode) {
        return true;
      }
      do {
        xnode_00 = xnode_00->next_attribute;
        if (xnode_00 == (xml_attribute_struct *)0x0) break;
      } while (xnode_00 != xnode);
      return xnode_00 != (xml_attribute_struct *)0x0;
    }
    if (this_00 == this_01) {
      bVar5 = false;
    }
    else {
      pxVar1 = this_00;
      pxVar2 = this_01;
      if (this_01 != (xml_node_struct *)0x0 && this_00 != (xml_node_struct *)0x0) {
        while ((rn = pxVar2, ln = pxVar1, ln != (xml_node_struct *)0x0 &&
               (rn != (xml_node_struct *)0x0))) {
          pxVar1 = ln->parent;
          pxVar2 = rn->parent;
          if (ln->parent == rn->parent) goto LAB_00129d4e;
        }
        bVar5 = ln == (xml_node_struct *)0x0;
        if (!bVar5) {
          do {
            ln = ln->parent;
            this_00 = this_00->parent;
          } while (ln != (xml_node_struct *)0x0);
        }
        for (; rn != (xml_node_struct *)0x0; rn = rn->parent) {
          this_01 = this_01->parent;
        }
        if (this_00 == this_01) {
          return bVar5;
        }
        do {
          rn = this_01;
          ln = this_00;
          this_00 = ln->parent;
          this_01 = rn->parent;
        } while (ln->parent != rn->parent);
LAB_00129d4e:
        bVar5 = node_is_before_sibling(ln,rn);
        return bVar5;
      }
      bVar5 = this_00 < this_01;
    }
  }
  else {
    bVar5 = pvVar3 < pvVar4;
  }
  return bVar5;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}